

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O1

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 __thiscall lrit::File::getDataFromBuffer(File *this)

{
  uint uVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long in_RSI;
  
  lVar4 = *(long *)(in_RSI + 0x20);
  lVar2 = *(long *)(in_RSI + 0x28);
  uVar1 = *(uint *)(in_RSI + 0x88);
  plVar3 = (long *)operator_new(0x158);
  std::ios_base::ios_base((ios_base *)(plVar3 + 10));
  plVar3[0x25] = 0;
  *(undefined2 *)(plVar3 + 0x26) = 0;
  plVar3[0x27] = 0;
  plVar3[0x28] = 0;
  plVar3[0x29] = 0;
  plVar3[0x2a] = 0;
  *plVar3 = 0x1e33a8;
  plVar3[10] = 0x1e33d0;
  plVar3[1] = 0;
  std::ios::init((streambuf *)(plVar3 + 10));
  lVar4 = (ulong)uVar1 + lVar4;
  *plVar3 = (long)&PTR__memstream_001e3358;
  plVar3[10] = (long)&PTR__memstream_001e3380;
  plVar3[2] = (long)std::filebuf::imbue;
  plVar3[3] = 0;
  plVar3[4] = 0;
  plVar3[5] = 0;
  plVar3[6] = 0;
  plVar3[7] = 0;
  plVar3[8] = 0;
  std::locale::locale((locale *)(plVar3 + 9));
  plVar3[2] = (long)&PTR__streambuf_001e3408;
  plVar3[3] = lVar4;
  plVar3[4] = lVar4;
  plVar3[5] = lVar2;
  std::ios::rdbuf((streambuf *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
  (this->file_)._M_dataplus._M_p = (pointer)plVar3;
  return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::istream> File::getDataFromBuffer() const {
  auto ms = std::make_unique<memstream>(
    buf_.data() + ph_.totalHeaderLength,
    buf_.size() - ph_.totalHeaderLength);
  return std::unique_ptr<std::istream>(ms.release());
}